

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGReader.cpp
# Opt level: O2

void __thiscall CFGReader::CFGReader(CFGReader *this,string *filename)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_CFGReader = (_func_int **)&PTR__CFGReader_001299a8;
  std::fstream::fstream(&this->m_input,(string *)filename,_S_in);
  p_Var1 = &(this->m_cfgs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_cfgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_cfgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_cfgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_cfgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_cfgs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

CFGReader::CFGReader(const std::string& filename)
	: m_input(filename, std::fstream::in) {
}